

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

QString * __thiscall
QAccessibleTableCell::text(QString *__return_storage_ptr__,QAccessibleTableCell *this,Text t)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  char cVar4;
  char16_t *tmp;
  QAbstractItemModel *pQVar5;
  long in_FS_OFFSET;
  QModelIndex local_90;
  QArrayDataPointer<char16_t> local_78;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  cVar4 = (**(code **)(*(long *)this + 0x10))(this);
  if (cVar4 == '\0') goto LAB_004dd8a7;
  pQVar5 = QAbstractItemView::model((QAbstractItemView *)(this->view).wp.value);
  if (t == Description) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_90,&this->m_index);
    (**(code **)(*(long *)pQVar5 + 0x90))(&local_58,pQVar5,&local_90,0xc);
    ::QVariant::toString();
    pDVar1 = local_78.d;
    local_78.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = local_78.ptr;
    local_78.ptr = (char16_t *)0x0;
  }
  else {
    if (t != Name) goto LAB_004dd8a7;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_90,&this->m_index);
    (**(code **)(*(long *)pQVar5 + 0x90))(&local_58,pQVar5,&local_90,0xb);
    ::QVariant::toString();
    qVar3 = local_78.size;
    pcVar2 = local_78.ptr;
    pDVar1 = local_78.d;
    local_78.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = local_78.ptr;
    local_78.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_78.size;
    local_78.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    ::QVariant::~QVariant(&local_58);
    if (qVar3 != 0) goto LAB_004dd8a7;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_90,&this->m_index);
    (**(code **)(*(long *)pQVar5 + 0x90))(&local_58,pQVar5,&local_90,0);
    ::QVariant::toString();
    (__return_storage_ptr__->d).d = local_78.d;
    (__return_storage_ptr__->d).ptr = local_78.ptr;
    local_78.d = pDVar1;
    local_78.ptr = pcVar2;
  }
  (__return_storage_ptr__->d).size = local_78.size;
  local_78.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  ::QVariant::~QVariant(&local_58);
LAB_004dd8a7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleTableCell::text(QAccessible::Text t) const
{
    QString value;
    if (!isValid())
        return value;
    QAbstractItemModel *model = view->model();
    switch (t) {
    case QAccessible::Name:
        value = model->data(m_index, Qt::AccessibleTextRole).toString();
        if (value.isEmpty())
            value = model->data(m_index, Qt::DisplayRole).toString();
        break;
    case QAccessible::Description:
        value = model->data(m_index, Qt::AccessibleDescriptionRole).toString();
        break;
    default:
        break;
    }
    return value;
}